

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

void google::protobuf::internal::
     arena_destruct_object<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
               (void *object)

{
  pointer pUVar1;
  
  pUVar1 = *(pointer *)((long)object + 8);
  if (pUVar1 != *(pointer *)((long)object + 0x10)) {
    UnknownFieldSet::ClearFallback((UnknownFieldSet *)((long)object + 8));
    pUVar1 = (((UnknownFieldSet *)((long)object + 8))->fields_).
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  if (pUVar1 != (pointer)0x0) {
    operator_delete(pUVar1);
    return;
  }
  return;
}

Assistant:

void arena_destruct_object(void* object) {
  reinterpret_cast<T*>(object)->~T();
}